

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

uint64_t ReadCompactSize<ParamsStream<BufferedFile&,TransactionSerParams>>
                   (ParamsStream<BufferedFile_&,_TransactionSerParams> *is,bool range_check)

{
  long lVar1;
  byte bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ser_readdata8<ParamsStream<BufferedFile&,TransactionSerParams>>(is);
  if (bVar2 < 0xfd) {
    uVar5 = (uint64_t)bVar2;
LAB_008d50c2:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return uVar5;
    }
  }
  else {
    if (bVar2 == 0xfe) {
      uVar4 = ser_readdata32<ParamsStream<BufferedFile&,TransactionSerParams>>(is);
      if (uVar4 < 0x10000) {
        pcVar6 = (char *)__cxa_allocate_exception(0x20);
        std::iostream_category();
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar6,(error_code *)"non-canonical ReadCompactSize()");
      }
      else {
        uVar5 = (uint64_t)uVar4;
LAB_008d50b2:
        if (!range_check || uVar5 < 0x2000001) goto LAB_008d50c2;
        pcVar6 = (char *)__cxa_allocate_exception(0x20);
        std::iostream_category();
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar6,(error_code *)"ReadCompactSize(): size too large");
      }
    }
    else if (bVar2 == 0xfd) {
      uVar3 = ser_readdata16<ParamsStream<BufferedFile&,TransactionSerParams>>(is);
      if (0xfc < uVar3) {
        uVar5 = (uint64_t)uVar3;
        goto LAB_008d50c2;
      }
      pcVar6 = (char *)__cxa_allocate_exception(0x20);
      std::iostream_category();
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar6,(error_code *)"non-canonical ReadCompactSize()");
    }
    else {
      uVar5 = ser_readdata64<ParamsStream<BufferedFile&,TransactionSerParams>>(is);
      if (uVar5 >> 0x20 != 0) goto LAB_008d50b2;
      pcVar6 = (char *)__cxa_allocate_exception(0x20);
      std::iostream_category();
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar6,(error_code *)"non-canonical ReadCompactSize()");
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

uint64_t ReadCompactSize(Stream& is, bool range_check = true)
{
    uint8_t chSize = ser_readdata8(is);
    uint64_t nSizeRet = 0;
    if (chSize < 253)
    {
        nSizeRet = chSize;
    }
    else if (chSize == 253)
    {
        nSizeRet = ser_readdata16(is);
        if (nSizeRet < 253)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    else if (chSize == 254)
    {
        nSizeRet = ser_readdata32(is);
        if (nSizeRet < 0x10000u)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    else
    {
        nSizeRet = ser_readdata64(is);
        if (nSizeRet < 0x100000000ULL)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    if (range_check && nSizeRet > MAX_SIZE) {
        throw std::ios_base::failure("ReadCompactSize(): size too large");
    }
    return nSizeRet;
}